

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O2

void my_canvas_dialog(t_my_canvas *x,t_symbol *s,int argc,t_atom *argv)

{
  t_iem_init_symargs *ptVar1;
  _glist *canvas;
  t_symbol *s_00;
  t_atomtype tVar2;
  int iVar3;
  t_float tVar4;
  t_float tVar5;
  t_float tVar6;
  uint uVar7;
  uint uVar8;
  t_symbol *srl [3];
  t_atom undo [18];
  
  tVar4 = atom_getfloatarg(0,argc,argv);
  tVar5 = atom_getfloatarg(2,argc,argv);
  tVar6 = atom_getfloatarg(3,argc,argv);
  iemgui_setdialogatoms(&x->x_gui,0x12,undo);
  tVar2 = A_FLOAT;
  undo[1].a_w.w_float = 0.0;
  undo[2].a_w._0_4_ = (undefined4)x->x_vis_w;
  undo[3].a_w._0_4_ = (undefined4)x->x_vis_h;
  undo[5].a_w.w_index = -0x40800000;
  undo[0xf].a_type = A_SYMBOL;
  undo[1].a_type = tVar2;
  undo[2].a_type = tVar2;
  undo[3].a_type = tVar2;
  undo[5].a_type = tVar2;
  undo[0xf].a_w.w_symbol = gensym("none");
  canvas = (x->x_gui).x_glist;
  s_00 = gensym("dialog");
  pd_undo_set_objectstate(canvas,(t_pd *)x,s_00,0x12,undo,argc,argv);
  iemgui_dialog(&x->x_gui,srl,argc,argv);
  ptVar1 = &(x->x_gui).x_isa;
  *(byte *)ptVar1 = *(byte *)ptVar1 & 0xfe;
  if (1 < (int)tVar4) {
    tVar2 = (int)tVar4;
  }
  iVar3 = tVar2 * ((x->x_gui).x_glist)->gl_zoom;
  (x->x_gui).x_w = iVar3;
  (x->x_gui).x_h = iVar3;
  uVar7 = -(uint)(1 < (int)tVar5);
  uVar8 = -(uint)(1 < (int)tVar6);
  x->x_vis_w = ~uVar7 & 1 | (int)tVar5 & uVar7;
  x->x_vis_h = ~uVar8 & 1 | (int)tVar6 & uVar8;
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void my_canvas_dialog(t_my_canvas *x, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *srl[3];
    int a = atom_getfloatarg(0, argc, argv);
    int w = atom_getfloatarg(2, argc, argv);
    int h = atom_getfloatarg(3, argc, argv);
    int sr_flags;
    t_atom undo[18];
    iemgui_setdialogatoms(&x->x_gui, 18, undo);
    SETFLOAT (undo+1, 0);
    SETFLOAT (undo+2, x->x_vis_w);
    SETFLOAT (undo+3, x->x_vis_h);
    SETFLOAT (undo+5, -1);
    SETSYMBOL(undo+15, gensym("none"));

    pd_undo_set_objectstate(x->x_gui.x_glist, (t_pd*)x, gensym("dialog"),
                            18, undo,
                            argc, argv);

    sr_flags = iemgui_dialog(&x->x_gui, srl, argc, argv);
    x->x_gui.x_isa.x_loadinit = 0;
    if(a < 1)
        a = 1;
    x->x_gui.x_w = a * IEMGUI_ZOOM(x);
    x->x_gui.x_h = x->x_gui.x_w;
    if(w < 1)
        w = 1;
    x->x_vis_w = w;
    if(h < 1)
        h = 1;
    x->x_vis_h = h;
    iemgui_size((void *)x, &x->x_gui);
}